

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::_PathArcToFastEx
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_sample,int a_max_sample,int a_step
          )

{
  float fVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ImVec2 *pIVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int a;
  
  if (radius < 0.5) {
    ImVector<ImVec2>::push_back(&this->_Path,center);
    return;
  }
  if (a_step < 1) {
    uVar4 = _CalcCircleAutoSegmentCount(this,radius);
    a_step = (int)(0x30 / (ulong)uVar4);
  }
  uVar4 = 0xc;
  if ((uint)a_step < 0xc) {
    uVar4 = a_step;
  }
  uVar11 = 1;
  uVar10 = uVar4;
  if (a_step == 0) {
    uVar10 = 1;
  }
  uVar5 = a_max_sample - a_min_sample;
  uVar2 = -uVar5;
  if (0 < (int)uVar5) {
    uVar2 = uVar5;
  }
  if (uVar10 < 2) {
    iVar9 = uVar2 + 1;
    bVar3 = false;
  }
  else if (uVar2 % uVar10 == 0) {
    bVar3 = false;
    iVar9 = uVar2 / uVar10 + 1;
    uVar11 = uVar4;
  }
  else {
    iVar9 = uVar2 / uVar10 + 2;
    bVar3 = true;
    uVar11 = (int)((char)((char)uVar10 - (char)(uVar2 % uVar10)) / -2) + uVar10;
  }
  ImVector<ImVec2>::resize(&this->_Path,(this->_Path).Size + iVar9);
  pIVar7 = (this->_Path).Data + ((long)(this->_Path).Size - (long)iVar9);
  iVar9 = a_min_sample;
  if (0x2f < (uint)a_min_sample) {
    iVar8 = a_min_sample % 0x30;
    iVar9 = iVar8 + 0x30;
    if (-1 < iVar8) {
      iVar9 = iVar8;
    }
  }
  if (a_max_sample < a_min_sample) {
    while (a_max_sample <= a_min_sample) {
      iVar8 = iVar9 + 0x30;
      if (-1 < iVar9) {
        iVar8 = iVar9;
      }
      fVar1 = this->_Data->ArcFastVtx[iVar8].y;
      pIVar7->x = this->_Data->ArcFastVtx[iVar8].x * radius + center->x;
      pIVar7->y = fVar1 * radius + center->y;
      pIVar7 = pIVar7 + 1;
      iVar9 = iVar8 - uVar11;
      a_min_sample = a_min_sample - uVar11;
      uVar11 = uVar10;
    }
  }
  else {
    while (a_min_sample <= a_max_sample) {
      iVar8 = iVar9 + -0x30;
      if (iVar9 < 0x30) {
        iVar8 = iVar9;
      }
      fVar1 = this->_Data->ArcFastVtx[iVar8].y;
      pIVar7->x = this->_Data->ArcFastVtx[iVar8].x * radius + center->x;
      pIVar7->y = fVar1 * radius + center->y;
      pIVar7 = pIVar7 + 1;
      iVar9 = iVar8 + uVar11;
      a_min_sample = a_min_sample + uVar11;
      uVar11 = uVar10;
    }
  }
  if (bVar3) {
    iVar9 = (int)((long)a_max_sample % 0x30);
    uVar6 = (ulong)(iVar9 + 0x30);
    if (-1 < iVar9) {
      uVar6 = (long)a_max_sample % 0x30 & 0xffffffff;
    }
    fVar1 = this->_Data->ArcFastVtx[uVar6].y;
    pIVar7->x = this->_Data->ArcFastVtx[uVar6].x * radius + center->x;
    pIVar7->y = radius * fVar1 + center->y;
  }
  return;
}

Assistant:

void ImDrawList::_PathArcToFastEx(const ImVec2& center, float radius, int a_min_sample, int a_max_sample, int a_step)
{
    if (radius < 0.5f)
    {
        _Path.push_back(center);
        return;
    }

    // Calculate arc auto segment step size
    if (a_step <= 0)
        a_step = IM_DRAWLIST_ARCFAST_SAMPLE_MAX / _CalcCircleAutoSegmentCount(radius);

    // Make sure we never do steps larger than one quarter of the circle
    a_step = ImClamp(a_step, 1, IM_DRAWLIST_ARCFAST_TABLE_SIZE / 4);

    const int sample_range = ImAbs(a_max_sample - a_min_sample);
    const int a_next_step = a_step;

    int samples = sample_range + 1;
    bool extra_max_sample = false;
    if (a_step > 1)
    {
        samples            = sample_range / a_step + 1;
        const int overstep = sample_range % a_step;

        if (overstep > 0)
        {
            extra_max_sample = true;
            samples++;

            // When we have overstep to avoid awkwardly looking one long line and one tiny one at the end,
            // distribute first step range evenly between them by reducing first step size.
            if (sample_range > 0)
                a_step -= (a_step - overstep) / 2;
        }
    }

    _Path.resize(_Path.Size + samples);
    ImVec2* out_ptr = _Path.Data + (_Path.Size - samples);

    int sample_index = a_min_sample;
    if (sample_index < 0 || sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
    {
        sample_index = sample_index % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (sample_index < 0)
            sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
    }

    if (a_max_sample >= a_min_sample)
    {
        for (int a = a_min_sample; a <= a_max_sample; a += a_step, sample_index += a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
                sample_index -= IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }
    else
    {
        for (int a = a_min_sample; a >= a_max_sample; a -= a_step, sample_index -= a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index < 0)
                sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }

    if (extra_max_sample)
    {
        int normalized_max_sample = a_max_sample % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (normalized_max_sample < 0)
            normalized_max_sample += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

        const ImVec2 s = _Data->ArcFastVtx[normalized_max_sample];
        out_ptr->x = center.x + s.x * radius;
        out_ptr->y = center.y + s.y * radius;
        out_ptr++;
    }

    IM_ASSERT_PARANOID(_Path.Data + _Path.Size == out_ptr);
}